

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::CapabilityStreamConnectionReceiver::acceptAuthenticated
          (CapabilityStreamConnectionReceiver *this)

{
  socklen_t *in_RCX;
  sockaddr *in_RDX;
  int in_ESI;
  CapabilityStreamConnectionReceiver local_20;
  CapabilityStreamConnectionReceiver *this_local;
  
  this_local = this;
  accept(&local_20,in_ESI,in_RDX,in_RCX);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  then<kj::CapabilityStreamConnectionReceiver::acceptAuthenticated()::__0>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)this,(Type *)&local_20);
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_20);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> CapabilityStreamConnectionReceiver::acceptAuthenticated() {
  return accept().then([](Own<AsyncIoStream>&& stream) {
    return AuthenticatedStream { kj::mv(stream), UnknownPeerIdentity::newInstance() };
  });
}